

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mplayer.c
# Opt level: O0

void create_mplayers(int num,boolean special)

{
  int iVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  bool local_9d;
  int local_9c;
  undefined1 local_98 [4];
  int tryct;
  monst fakemon;
  int y;
  int x;
  int pm;
  boolean special_local;
  int num_local;
  
  pm = num;
  while( true ) {
    if (pm == 0) {
      return;
    }
    local_9c = 0;
    iVar3 = rn2(0x10);
    fakemon.nmon = (monst *)(mons + (iVar3 + 0x159));
    do {
      iVar1 = local_9c;
      iVar4 = rn2(0x4c);
      fakemon._116_4_ = rnd(0x13);
      bVar2 = goodpos(level,iVar4 + 2,fakemon._116_4_,(monst *)local_98,0);
      if (bVar2 == '\0') {
        local_9c = local_9c + 1;
      }
      local_9d = bVar2 == '\0' && iVar1 < 0x33;
    } while (local_9d);
    if (0x32 < local_9c) break;
    mk_mplayer(mons + (iVar3 + 0x159),level,(xchar)(iVar4 + 2),fakemon._116_1_,special);
    pm = pm + -1;
  }
  return;
}

Assistant:

void create_mplayers(int num, boolean special)
{
	int pm, x, y;
	struct monst fakemon;

	while (num) {
		int tryct = 0;

		/* roll for character class */
		pm = PM_ARCHEOLOGIST + rn2(PM_WIZARD - PM_ARCHEOLOGIST + 1);
		fakemon.data = &mons[pm];

		/* roll for an available location */
		do {
		    x = rn1(COLNO-4, 2);
		    y = rnd(ROWNO-2);
		} while (!goodpos(level, x, y, &fakemon, 0) && tryct++ <= 50);

		/* if pos not found in 50 tries, don't bother to continue */
		if (tryct > 50) return;

		mk_mplayer(&mons[pm], level, (xchar)x, (xchar)y, special);
		num--;
	}
}